

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

void __thiscall Matrix::Matrix(Matrix *this,int n,int m,int item)

{
  allocator_type local_4a;
  allocator_type local_49;
  vector<Fraction,_std::allocator<Fraction>_> local_48;
  Fraction local_30;
  
  this->n_ = n;
  this->m_ = m;
  Fraction::Fraction(&local_30,item);
  std::vector<Fraction,_std::allocator<Fraction>_>::vector(&local_48,(long)m,&local_30,&local_49);
  std::
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  ::vector(&this->elements_,(long)n,&local_48,&local_4a);
  if (local_48.super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

Matrix::Matrix(int n, int m, int item)
    : n_(n), m_(m),
      elements_(std::vector<std::vector<Fraction>>(n, std::vector<Fraction>(m, item))) {}